

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  secp256k1_fe *b;
  uint64_t *t;
  secp256k1_fe *psVar9;
  int iVar10;
  secp256k1_fe *in_RSI;
  secp256k1_fe *psVar11;
  ulong uVar12;
  secp256k1_fe *psVar13;
  secp256k1_fe *psVar14;
  uint64_t *puVar15;
  secp256k1_fe *psVar16;
  uint64_t *puVar17;
  secp256k1_fe *psVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  secp256k1_fe *unaff_R14;
  secp256k1_fe *psVar23;
  secp256k1_fe sqrt;
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 s;
  secp256k1_fe sStack_1d0;
  secp256k1_fe *psStack_1a0;
  secp256k1_fe *psStack_198;
  undefined8 uStack_188;
  undefined1 auStack_180 [48];
  ulong uStack_150;
  secp256k1_fe *psStack_148;
  undefined1 auStack_140 [40];
  secp256k1_modinv64_trans2x2 sStack_118;
  secp256k1_fe *psStack_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  secp256k1_modinv64_signed62 local_68;
  secp256k1_fe local_40;
  
  psVar13 = &local_c8;
  psVar23 = &local_c8;
  b = &local_c8;
  local_98.n[0] = x->n[0];
  local_98.n[1] = x->n[1];
  local_98.n[2] = x->n[2];
  local_98.n[3] = x->n[3];
  local_98.n[4] = x->n[4];
  local_98.magnitude = x->magnitude;
  local_98.normalized = x->normalized;
  secp256k1_fe_verify(x);
  local_c8.n[0] = x->n[0];
  local_c8.n[1] = x->n[1];
  local_c8.n[2] = x->n[2];
  local_c8.n[3] = x->n[3];
  local_c8.n[4] = x->n[4];
  local_c8.magnitude = x->magnitude;
  local_c8.normalized = x->normalized;
  secp256k1_fe_normalize_var(&local_c8);
  secp256k1_fe_verify(&local_c8);
  if (local_c8.normalized == 0) {
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((local_c8.n[2] == 0 && local_c8.n[3] == 0) && (local_c8.n[1] == 0 && local_c8.n[0] == 0))
        && local_c8.n[4] == 0) {
      b = (secp256k1_fe *)0x1;
    }
    else {
      local_68.v[0] = (local_c8.n[1] << 0x34 | local_c8.n[0]) & 0x3fffffffffffffff;
      local_68.v[1] = (ulong)((uint)local_c8.n[2] & 0xfffff) << 0x2a | local_c8.n[1] >> 10;
      local_68.v[2] = (ulong)((uint)local_c8.n[3] & 0x3fffffff) << 0x20 | local_c8.n[2] >> 0x14;
      local_68.v[3] = (local_c8.n[4] & 0xffffffffff) << 0x16 | local_c8.n[3] >> 0x1e;
      local_68.v[4] = local_c8.n[4] >> 0x28;
      uVar3 = secp256k1_jacobi64_maybe_var(&local_68,&secp256k1_const_modinfo_fe);
      if (uVar3 == 0) {
        uVar3 = secp256k1_fe_sqrt(&local_40,&local_c8);
        b = (secp256k1_fe *)(ulong)uVar3;
      }
      else {
        b = (secp256k1_fe *)(ulong)(~uVar3 >> 0x1f);
      }
    }
    unaff_R14 = &local_98;
    secp256k1_fe_verify(unaff_R14);
    local_98.n[0] = (local_98.n[4] >> 0x30) * 0x1000003d1 + local_98.n[0];
    local_98.n[1] = (local_98.n[0] >> 0x34) + local_98.n[1];
    local_98.n[2] = (local_98.n[1] >> 0x34) + local_98.n[2];
    uVar12 = (local_98.n[2] >> 0x34) + local_98.n[3];
    local_98.n[3] = uVar12 & 0xfffffffffffff;
    local_98.n[4] = (uVar12 >> 0x34) + (local_98.n[4] & 0xffffffffffff);
    local_98.n[2] = local_98.n[2] & 0xfffffffffffff;
    local_98.n[1] = local_98.n[1] & 0xfffffffffffff;
    local_98.n[0] = local_98.n[0] & 0xfffffffffffff;
    local_98.magnitude = 1;
    secp256k1_fe_verify(unaff_R14);
    in_RSI = unaff_R14;
    iVar4 = secp256k1_fe_sqrt(&local_c8,unaff_R14);
    psVar13 = psVar23;
    if ((int)b == iVar4) {
      return (int)b;
    }
  }
  secp256k1_fe_is_square_var_cold_1();
  psStack_f8 = b;
  auStack_140._32_8_ = in_RSI->n[4];
  auStack_140._16_8_ = in_RSI->n[2];
  auStack_140._24_8_ = in_RSI->n[3];
  auStack_140._0_8_ = in_RSI->n[0];
  auStack_140._8_8_ = in_RSI->n[1];
  auStack_180._0_8_ = psVar13->n[0];
  auStack_180._8_8_ = psVar13->n[1];
  auStack_180._16_8_ = psVar13->n[2];
  auStack_180._24_8_ = psVar13->n[3];
  auStack_180._32_8_ = psVar13->n[4];
  if (((((long)auStack_180._0_8_ < 0) || ((long)auStack_180._8_8_ < 0)) ||
      (b = in_RSI, (long)auStack_180._16_8_ < 0)) ||
     ((psVar13 = (secp256k1_fe *)auStack_180._24_8_, (long)auStack_180._24_8_ < 0 ||
      ((long)auStack_180._32_8_ < 0)))) {
LAB_0015377e:
    psStack_198 = (secp256k1_fe *)0x153783;
    secp256k1_jacobi64_maybe_var_cold_18();
LAB_00153783:
    psVar23 = psVar13;
    psStack_198 = (secp256k1_fe *)0x153788;
    secp256k1_jacobi64_maybe_var_cold_11();
LAB_00153788:
    psStack_198 = (secp256k1_fe *)0x15378d;
    secp256k1_jacobi64_maybe_var_cold_10();
LAB_0015378d:
    psVar14 = psVar23;
    psStack_198 = (secp256k1_fe *)0x153792;
    secp256k1_jacobi64_maybe_var_cold_9();
LAB_00153792:
    psStack_198 = (secp256k1_fe *)0x153797;
    secp256k1_jacobi64_maybe_var_cold_8();
    in_RSI = b;
    psVar13 = psVar14;
    psVar23 = unaff_R14;
  }
  else {
    psVar23 = unaff_R14;
    if (((auStack_180._16_8_ != 0 || (secp256k1_fe *)auStack_180._24_8_ != (secp256k1_fe *)0x0) ||
        (auStack_180._8_8_ != 0 || auStack_180._0_8_ != 0)) || auStack_180._32_8_ != 0) {
      unaff_R14 = (secp256k1_fe *)0x5;
      lVar22 = -1;
      uStack_150 = 0;
      uVar3 = 0;
      auStack_180._40_8_ = in_RSI;
      do {
        b = (secp256k1_fe *)auStack_180._40_8_;
        psVar13 = (secp256k1_fe *)(auStack_140._8_8_ << 0x3e | auStack_140._0_8_);
        puVar15 = (uint64_t *)(auStack_180._8_8_ << 0x3e | auStack_180._0_8_);
        lVar5 = 0;
        psVar16 = (secp256k1_fe *)0x0;
        lVar21 = 1;
        iVar4 = 0x3e;
        psVar23 = (secp256k1_fe *)0x1;
        puVar17 = puVar15;
        psVar14 = psVar13;
        while( true ) {
          uVar12 = -1L << ((byte)iVar4 & 0x3f) | (ulong)puVar17;
          lVar6 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          bVar7 = (byte)lVar6;
          psVar18 = (secp256k1_fe *)((ulong)puVar17 >> (bVar7 & 0x3f));
          psVar23 = (secp256k1_fe *)((long)psVar23 << (bVar7 & 0x3f));
          lVar5 = lVar5 << (bVar7 & 0x3f);
          lVar22 = lVar22 - lVar6;
          uVar3 = ((uint)((ulong)psVar14 >> 1) ^ (uint)((ulong)psVar14 >> 2)) & (uint)lVar6 ^ uVar3;
          iVar4 = iVar4 - (uint)lVar6;
          psStack_148 = unaff_R14;
          if (iVar4 == 0) break;
          if (((ulong)psVar14 & 1) == 0) {
            psStack_198 = (secp256k1_fe *)0x15374c;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_0015374c:
            psStack_198 = (secp256k1_fe *)0x153751;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_00153751:
            psStack_198 = (secp256k1_fe *)0x153756;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_00153756:
            psStack_198 = (secp256k1_fe *)0x15375b;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_0015375b;
          }
          if (((ulong)psVar18 & 1) == 0) goto LAB_0015374c;
          bVar7 = 0x3e - (char)iVar4;
          in_RSI = (secp256k1_fe *)((long)psVar14 << (bVar7 & 0x3f));
          if ((secp256k1_fe *)(lVar5 * (long)puVar15 + (long)psVar23 * (long)psVar13) != in_RSI)
          goto LAB_00153751;
          in_RSI = (secp256k1_fe *)(lVar21 * (long)puVar15 + (long)psVar16 * (long)psVar13);
          if (in_RSI != (secp256k1_fe *)((long)psVar18 << (bVar7 & 0x3f))) goto LAB_00153756;
          iVar19 = (int)psVar14;
          iVar10 = (int)psVar18;
          if (lVar22 < 0) {
            lVar22 = -lVar22;
            iVar8 = (int)lVar22 + 1;
            if (iVar4 <= iVar8) {
              iVar8 = iVar4;
            }
            if (0xffffffc1 < iVar8 - 0x3fU) {
              uVar3 = uVar3 ^ (uint)(((ulong)psVar18 & (ulong)psVar14) >> 1);
              in_RSI = (secp256k1_fe *)
                       ((ulong)(0x3fL << (-(char)iVar8 & 0x3fU)) >> (-(char)iVar8 & 0x3fU));
              uVar20 = (iVar10 * iVar10 + 0x3e) * iVar10 * iVar19 & (uint)in_RSI;
              lVar6 = lVar5;
              lVar5 = lVar21;
              psVar9 = psVar18;
              psVar11 = psVar23;
              psVar23 = psVar16;
              goto LAB_00153536;
            }
            goto LAB_00153765;
          }
          iVar8 = (int)lVar22 + 1;
          if (iVar4 <= iVar8) {
            iVar8 = iVar4;
          }
          if (iVar8 - 0x3fU < 0xffffffc2) goto LAB_00153760;
          in_RSI = (secp256k1_fe *)
                   ((ulong)(0xfL << (-(char)iVar8 & 0x3fU)) >> (-(char)iVar8 & 0x3fU));
          uVar20 = -(iVar10 * ((iVar19 * 2 + 2U & 8) + iVar19)) & (uint)in_RSI;
          lVar6 = lVar21;
          psVar9 = psVar14;
          psVar11 = psVar16;
          psVar14 = psVar18;
LAB_00153536:
          uVar12 = (ulong)uVar20;
          puVar17 = (uint64_t *)((long)psVar14->n + uVar12 * (long)psVar9);
          psVar16 = (secp256k1_fe *)((long)psVar11->n + (long)psVar23 * uVar12);
          lVar21 = uVar12 * lVar5 + lVar6;
          psVar14 = psVar9;
          if (((ulong)puVar17 & (ulong)in_RSI) != 0) {
LAB_0015375b:
            psStack_198 = (secp256k1_fe *)0x153760;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00153760:
            psStack_198 = (secp256k1_fe *)0x153765;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_00153765:
            psStack_198 = (secp256k1_fe *)0x15376a;
            secp256k1_jacobi64_maybe_var_cold_5();
            b = in_RSI;
            unaff_R14 = psVar23;
            goto LAB_0015376a;
          }
        }
        psVar13 = SUB168(SEXT816(lVar5) * SEXT816((long)psVar16),8);
        lVar6 = (long)psVar23 * lVar21 - lVar5 * (long)psVar16;
        uVar12 = (ulong)((ulong)((long)psVar23 * lVar21) < (ulong)(lVar5 * (long)psVar16));
        uVar1 = SUB168(SEXT816((long)psVar23) * SEXT816(lVar21),8) - (long)psVar13;
        psVar14 = (secp256k1_fe *)auStack_180;
        sStack_118.u = (int64_t)psVar23;
        sStack_118.v = lVar5;
        sStack_118.q = (int64_t)psVar16;
        sStack_118.r = lVar21;
        if ((uVar1 - uVar12 != -1 || lVar6 != -0x4000000000000000) &&
           (lVar6 != 0x4000000000000000 || uVar1 != uVar12)) goto LAB_0015379c;
        psVar23 = (secp256k1_fe *)auStack_140;
        iVar10 = (int)unaff_R14;
        psStack_198 = (secp256k1_fe *)0x1535e4;
        psVar13 = psVar23;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar23,iVar10,
                           (secp256k1_modinv64_signed62 *)auStack_180._40_8_,0);
        if (iVar4 < 1) {
LAB_0015376a:
          psStack_198 = (secp256k1_fe *)0x15376f;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_0015376f:
          psStack_198 = (secp256k1_fe *)0x153774;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_00153774:
          psStack_198 = (secp256k1_fe *)0x153779;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00153779:
          psStack_198 = (secp256k1_fe *)0x15377e;
          secp256k1_jacobi64_maybe_var_cold_12();
          goto LAB_0015377e;
        }
        psStack_198 = (secp256k1_fe *)0x1535ff;
        psVar13 = psVar23;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar23,iVar10,
                           (secp256k1_modinv64_signed62 *)b,1);
        if (0 < iVar4) goto LAB_0015376f;
        psStack_198 = (secp256k1_fe *)0x153617;
        psVar13 = psVar14;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar14,iVar10,
                           (secp256k1_modinv64_signed62 *)b,0);
        if (iVar4 < 1) goto LAB_00153774;
        psStack_198 = (secp256k1_fe *)0x153632;
        psVar13 = psVar14;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar14,iVar10,
                           (secp256k1_modinv64_signed62 *)b,1);
        if (-1 < iVar4) goto LAB_00153779;
        psStack_198 = (secp256k1_fe *)0x15364d;
        secp256k1_modinv64_update_fg_62_var
                  (iVar10,(secp256k1_modinv64_signed62 *)psVar23,
                   (secp256k1_modinv64_signed62 *)psVar14,&sStack_118);
        if (auStack_140._0_8_ == 1) {
          if (1 < iVar10) {
            psVar13 = (secp256k1_fe *)0x1;
            uVar12 = 0;
            do {
              uVar12 = uVar12 | *(ulong *)(auStack_140 + (long)psVar13 * 8);
              psVar13 = (secp256k1_fe *)((long)psVar13->n + 1);
            } while (unaff_R14 != psVar13);
            if (uVar12 != 0) goto LAB_0015367f;
          }
          uStack_188._4_4_ = 1 - (uVar3 * 2 & 2);
          bVar2 = false;
        }
        else {
LAB_0015367f:
          lVar5 = (long)iVar10;
          if ((-1 < lVar5 + -2 && (&psStack_148)[lVar5] == (secp256k1_fe *)0x0) &&
              (&uStack_188)[lVar5] == 0) {
            unaff_R14 = (secp256k1_fe *)(ulong)(iVar10 - 1);
          }
          psStack_198 = (secp256k1_fe *)0x1536ac;
          iVar10 = (int)unaff_R14;
          psVar13 = psVar23;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar23,iVar10,
                             (secp256k1_modinv64_signed62 *)b,0);
          if (iVar4 < 1) goto LAB_00153783;
          psStack_198 = (secp256k1_fe *)0x1536c7;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar23,iVar10,
                             (secp256k1_modinv64_signed62 *)b,1);
          if (0 < iVar4) goto LAB_00153788;
          psStack_198 = (secp256k1_fe *)0x1536df;
          psVar23 = psVar14;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar14,iVar10,
                             (secp256k1_modinv64_signed62 *)b,0);
          if (iVar4 < 1) goto LAB_0015378d;
          psStack_198 = (secp256k1_fe *)0x1536fa;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar14,iVar10,
                             (secp256k1_modinv64_signed62 *)b,1);
          bVar2 = true;
          if (-1 < iVar4) goto LAB_00153792;
        }
        if (!bVar2) {
          return uStack_188._4_4_;
        }
        uVar20 = (int)uStack_150 + 1;
        uStack_150 = (ulong)uVar20;
        in_RSI = b;
        if (uVar20 == 0xc) {
          return 0;
        }
      } while( true );
    }
  }
  psStack_198 = (secp256k1_fe *)0x15379c;
  secp256k1_jacobi64_maybe_var_cold_17();
LAB_0015379c:
  psStack_198 = (secp256k1_fe *)secp256k1_ge_x_on_curve_var;
  secp256k1_jacobi64_maybe_var_cold_16();
  psStack_1a0 = in_RSI;
  psStack_198 = psVar23;
  secp256k1_fe_sqr(&sStack_1d0,psVar13);
  secp256k1_fe_mul(&sStack_1d0,&sStack_1d0,psVar13);
  secp256k1_fe_verify(&sStack_1d0);
  sStack_1d0.n[0] = sStack_1d0.n[0] + 7;
  sStack_1d0.magnitude = sStack_1d0.magnitude + 1;
  sStack_1d0.normalized = 0;
  secp256k1_fe_verify(&sStack_1d0);
  iVar4 = secp256k1_fe_is_square_var(&sStack_1d0);
  return iVar4;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    SECP256K1_FE_VERIFY(x);

    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}